

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

void Abc_ObjDeleteFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  uint uVar1;
  int *piVar2;
  undefined8 in_RAX;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  bool bVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x71,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x72,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk != pFanin->pNtk) {
    __assert_fail("pObj->pNtk == pFanin->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x73,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  uVar4 = (ulong)(uint)pObj->Id;
  if ((pObj->Id < 0) || (uVar1 = pFanin->Id, (int)uVar1 < 0)) {
    __assert_fail("pObj->Id >= 0 && pFanin->Id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x74,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar3 = (pObj->vFanins).nSize;
  if ((long)iVar3 < 1) {
    if (iVar3 != 0) {
LAB_0085cad4:
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
  }
  else {
    piVar2 = (pObj->vFanins).pArray;
    lVar6 = 1;
    do {
      if (piVar2[lVar6 + -1] == uVar1) {
        uVar5 = uVar4;
        if ((int)lVar6 < iVar3) {
          do {
            piVar2[lVar6 + -1] = piVar2[lVar6];
            lVar6 = lVar6 + 1;
            iVar3 = (pObj->vFanins).nSize;
          } while ((int)lVar6 < iVar3);
          uVar5 = (ulong)(uint)pObj->Id;
        }
        (pObj->vFanins).nSize = iVar3 + -1;
        iVar3 = (pFanin->vFanouts).nSize;
        if ((long)iVar3 < 1) {
          if (iVar3 != 0) goto LAB_0085cad4;
        }
        else {
          piVar2 = (pFanin->vFanouts).pArray;
          lVar6 = 1;
          do {
            if (piVar2[lVar6 + -1] == (int)uVar5) {
              if ((int)lVar6 < iVar3) {
                do {
                  piVar2[lVar6 + -1] = piVar2[lVar6];
                  lVar6 = lVar6 + 1;
                  iVar3 = (pFanin->vFanouts).nSize;
                } while ((int)lVar6 < iVar3);
              }
              (pFanin->vFanouts).nSize = iVar3 + -1;
              return;
            }
            bVar7 = lVar6 != iVar3;
            lVar6 = lVar6 + 1;
          } while (bVar7);
        }
        __format = "The obj %d is not found among the fanouts of obj %d ...\n";
        uVar4 = (ulong)(uint)pFanin->Id;
        goto LAB_0085ca34;
      }
      bVar7 = lVar6 != iVar3;
      lVar6 = lVar6 + 1;
    } while (bVar7);
  }
  __format = "The obj %d is not found among the fanins of obj %d ...\n";
  uVar5 = (ulong)uVar1;
LAB_0085ca34:
  printf(__format,uVar5,uVar4,in_RAX);
  return;
}

Assistant:

void Abc_ObjDeleteFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFanin) );
    assert( pObj->pNtk == pFanin->pNtk );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( !Vec_IntRemove( &pObj->vFanins, pFanin->Id ) )
    {
        printf( "The obj %d is not found among the fanins of obj %d ...\n", pFanin->Id, pObj->Id );
        return;
    }
    if ( !Vec_IntRemove( &pFanin->vFanouts, pObj->Id ) )
    {
        printf( "The obj %d is not found among the fanouts of obj %d ...\n", pObj->Id, pFanin->Id );
        return;
    }
}